

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkpar.c
# Opt level: O1

action * get_shifts(int stateno)

{
  int iVar1;
  int iVar2;
  shifts *psVar3;
  action *paVar4;
  action *paVar5;
  long lVar6;
  
  psVar3 = shift_table[stateno];
  if ((psVar3 == (shifts *)0x0) || ((long)psVar3->nshifts < 1)) {
    paVar5 = (action *)0x0;
  }
  else {
    lVar6 = (long)psVar3->nshifts + 1;
    paVar4 = (action *)0x0;
    do {
      iVar1 = psVar3->shift[lVar6 + -2];
      iVar2 = accessing_symbol[iVar1];
      paVar5 = paVar4;
      if (iVar2 < start_symbol) {
        paVar5 = (action *)allocate(0x18);
        paVar5->next = paVar4;
        paVar5->symbol = iVar2;
        paVar5->number = iVar1;
        paVar5->prec = symbol_prec[iVar2];
        paVar5->action_code = '\x01';
        paVar5->assoc = symbol_assoc[iVar2];
      }
      lVar6 = lVar6 + -1;
      paVar4 = paVar5;
    } while (1 < lVar6);
  }
  return paVar5;
}

Assistant:

action *get_shifts(int stateno)
{
    register action *actions, *temp;
    register shifts *sp;
    register Yshort *to_state;
    register int i, k;
    register int symbol;

    actions = 0;
    sp = shift_table[stateno];
    if (sp)
    {
	to_state = sp->shift;
	for (i = sp->nshifts - 1; i >= 0; i--)
	{
	    k = to_state[i];
	    symbol = accessing_symbol[k];
	    if (ISTOKEN(symbol))
	    {
		temp = NEW(action);
		temp->next = actions;
		temp->symbol = symbol;
		temp->number = k;
		temp->prec = symbol_prec[symbol];
		temp->action_code = SHIFT;
		temp->assoc = symbol_assoc[symbol];
		actions = temp;
	    }
	}
    }
    return (actions);
}